

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  bool bVar1;
  long lVar2;
  int file_count;
  iterator cur;
  allocator local_dd;
  int local_dc;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  string local_b8;
  string local_98;
  MultipartContentHeader local_78;
  iterator local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_58._M_node = (_Base_ptr)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_dc;
  local_dc = 0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5601:11)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5601:11)>
             ::_M_manager;
  local_d8._M_unused._M_object = req;
  local_b8._M_string_length = (size_type)&local_58;
  local_b8.field_2._M_allocated_capacity = (size_type)req;
  std::function<bool(httplib::MultipartFormData_const&)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(httplib::MultipartFormData_const&)_1_,void>
            ((function<bool(httplib::MultipartFormData_const&)> *)&local_78,
             (anon_class_24_3_e9c7ffdf *)&local_b8);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5614:11)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:5614:11)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_58;
  bVar1 = read_content_core(this,strm,req,res,(ContentReceiver *)&local_d8,&local_78,
                            (ContentReceiver *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_98,"Content-Type",&local_dd);
    Request::get_header_value(&local_b8,req,&local_98,0);
    std::__cxx11::string::~string((string *)&local_98);
    lVar2 = std::__cxx11::string::find((char *)&local_b8,0x1584a2);
    bVar1 = true;
    if (lVar2 == 0) {
      if ((req->body)._M_string_length < 0x2001) {
        detail::parse_query_text(&req->body,&req->params);
      }
      else {
        res->status = 0x19d;
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto file_count = 0;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            if (file_count++ == CPPHTTPLIB_MULTIPART_FORM_DATA_FILE_MAX_COUNT) {
              return false;
            }
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_FORM_URL_ENCODED_PAYLOAD_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}